

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O0

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::run
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this)

{
  byte bVar1;
  RABlock *pRVar2;
  long lVar3;
  undefined1 *puVar4;
  bool bVar5;
  Error EVar6;
  RAWorkReg **ppRVar7;
  byte *pbVar8;
  uint64_t uVar9;
  RABlock *pRVar10;
  void *pvVar11;
  void *pvVar12;
  uint *puVar13;
  RABlock *pRVar14;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *in_RDI;
  RABlock *block;
  iterator __end3;
  iterator __begin3;
  ZoneVector<asmjit::v1_14::RABlock_*> *__range3;
  Error _err_21;
  Error _err_20;
  Error _err_19;
  RABlock *consecutive_1;
  Error _err_18;
  Error _err_17;
  RABlock *consecutive;
  Error _err_16;
  Error _err_15;
  Error _err_14;
  Error _err_13;
  RABlock *consecutiveBlock;
  Error _err_12;
  Error _err_11;
  Error _err_10;
  RABlock *targetBlock_1;
  Error _err_9;
  LabelNode *labelNode_1;
  uint32_t id;
  const_iterator __end10;
  const_iterator __begin10;
  ZoneVector<unsigned_int> *__range10;
  uint64_t timestamp;
  JumpAnnotation *jumpAnnotation;
  Error _err_8;
  RABlock *targetBlock;
  Error _err_7;
  LabelNode *labelNode;
  Operand *opArray;
  uint32_t opCount;
  Error _err_6;
  uint32_t useId;
  RAWorkReg *workReg;
  RATiedReg *tiedReg;
  RATiedReg *__end6;
  RATiedReg *__begin6;
  RAInstBuilder *__range6;
  uint32_t fixedRegCount;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  InstControlFlow cf;
  InstNode *inst;
  Error _err_2;
  Error _err_1;
  BaseNode *prev;
  BaseNode *next;
  ZoneVector<asmjit::v1_14::RABlock_*> blocksWithUnknownJumps;
  RAInstBuilder ib;
  BaseNode *node;
  RABlock *entryBlock;
  Error _err;
  BaseRAPass *in_stack_ffffffffffffe6f8;
  undefined4 in_stack_ffffffffffffe700;
  uint32_t in_stack_ffffffffffffe704;
  Error in_stack_ffffffffffffe708;
  Error in_stack_ffffffffffffe70c;
  BaseRAPass *in_stack_ffffffffffffe710;
  BaseRAPass *in_stack_ffffffffffffe718;
  undefined4 in_stack_ffffffffffffe720;
  undefined3 uVar15;
  uint32_t in_stack_ffffffffffffe724;
  BaseRAPass *pBVar16;
  BaseRAPass *cbLabel;
  BaseRAPass *this_00;
  RAInstBuilder *in_stack_ffffffffffffe748;
  RABlock *in_stack_ffffffffffffe750;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *in_stack_ffffffffffffe758;
  undefined4 in_stack_ffffffffffffe760;
  undefined4 in_stack_ffffffffffffe764;
  RABlock *in_stack_ffffffffffffe770;
  undefined4 in_stack_ffffffffffffe778;
  Error in_stack_ffffffffffffe77c;
  BaseRAPass *in_stack_ffffffffffffe780;
  RABlock *local_1868;
  undefined4 in_stack_ffffffffffffe7b8;
  Error in_stack_ffffffffffffe7bc;
  InvokeNode *in_stack_ffffffffffffe7c0;
  undefined4 in_stack_ffffffffffffe7c8;
  undefined4 in_stack_ffffffffffffe7cc;
  RACFGBuilder *in_stack_ffffffffffffe7d0;
  RACFGBuilder *local_1828;
  long local_1810;
  undefined1 *local_17b8;
  int local_1794;
  FuncNode *local_1778;
  ZoneVectorBase local_1770;
  undefined4 local_1760;
  undefined4 local_175c;
  undefined4 uVar17;
  InvokeNode *in_stack_ffffffffffffe8a8;
  RACFGBuilder *in_stack_ffffffffffffe8b0;
  RARegsStats RVar18;
  Array<unsigned_int,_4UL> aAStack_1748 [2];
  undefined1 *local_1728;
  undefined1 local_1720 [328];
  RAInstBuilder *in_stack_ffffffffffffea28;
  Array<asmjit::v1_14::RAStrategy,_4UL> in_stack_ffffffffffffea30;
  InstNode *in_stack_ffffffffffffea38;
  RACFGBuilder *in_stack_ffffffffffffea40;
  char *in_stack_ffffffffffffeaf0;
  int in_stack_ffffffffffffeafc;
  char *in_stack_ffffffffffffeb00;
  FuncNode *local_720;
  Error local_6fc;
  uint local_9c;
  RARegsStats *local_98;
  uint local_8c;
  Array<unsigned_int,_4UL> *local_88;
  uint local_7c;
  uint32_t *local_78;
  uint local_6c;
  ZoneAllocator *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  long *local_50;
  long *local_48;
  undefined4 local_3c;
  RABlock *local_38;
  undefined4 local_2c;
  RABlock *local_28;
  BaseRAPass *local_20;
  RABlocks *local_18;
  ZoneVectorBase *local_10;
  ZoneVectorBase *local_8;
  
  log<>((RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)
        CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
        (char *)in_stack_ffffffffffffe6f8);
  local_6fc = prepare((RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)in_stack_ffffffffffffe718);
  if (local_6fc == 0) {
    logNode((RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)in_stack_ffffffffffffe710,
            (BaseNode *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
            in_stack_ffffffffffffe704,(char *)in_stack_ffffffffffffe6f8);
    logBlock((RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)in_stack_ffffffffffffe710,
             (RABlock *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
             in_stack_ffffffffffffe704);
    pRVar2 = in_RDI->_curBlock;
    local_720 = *(FuncNode **)&in_RDI->_funcNode->field_0x8;
    if (local_720 == (FuncNode *)0x0) {
      local_6fc = DebugUtils::errored(3);
    }
    else {
      *(FuncNode **)(in_RDI->_curBlock + 0x10) = in_RDI->_funcNode;
      *(FuncNode **)(in_RDI->_curBlock + 0x18) = in_RDI->_funcNode;
      pBVar16 = (BaseRAPass *)&local_1760;
      RARegsStats::RARegsStats((RARegsStats *)&stack0xffffffffffffe8b4);
      cbLabel = pBVar16;
      this_00 = pBVar16;
      *(undefined4 *)&((BaseEmitter *)&pBVar16->super_FuncPass)->_vptr_BaseEmitter = 0xffffffff;
      *(undefined4 *)((long)&((BaseEmitter *)&pBVar16->super_FuncPass)->_vptr_BaseEmitter + 4) = 0;
      *(EmitterType *)&(pBVar16->super_FuncPass).super_Pass._cb = kNone;
      *(EmitterFlags *)((long)&(pBVar16->super_FuncPass).super_Pass._cb + 1) = kNone;
      *(uint8_t *)((long)&(pBVar16->super_FuncPass).super_Pass._cb + 2) = '\0';
      *(uint8_t *)((long)&(pBVar16->super_FuncPass).super_Pass._cb + 3) = '\0';
      ((BaseEmitter *)&pBVar16->super_FuncPass)->_validationFlags = kNone;
      ((BaseEmitter *)&pBVar16->super_FuncPass)->_diagnosticOptions = kNone;
      *(undefined4 *)&((BaseEmitter *)&pBVar16->super_FuncPass)->field_0x14 = 0;
      local_68 = &pBVar16->_allocator;
      local_6c = 0;
      Support::Array<unsigned_int,_4UL>::fill((Array<unsigned_int,_4UL> *)local_68,&local_6c);
      local_78 = (uint32_t *)&this_00->field_0x28;
      local_7c = 0;
      Support::Array<unsigned_int,_4UL>::fill((Array<unsigned_int,_4UL> *)local_78,&local_7c);
      *(undefined1 **)&this_00->field_0x38 = &this_00->field_0x40;
      ZoneVectorBase::ZoneVectorBase(&local_1770);
LAB_001fae06:
      do {
        local_1778 = *(FuncNode **)&local_720->field_0x8;
        uVar15 = (undefined3)in_stack_ffffffffffffe724;
        in_stack_ffffffffffffe724 = CONCAT13(1,uVar15);
        if (*(int *)&local_720->field_0x14 != 0) {
          in_stack_ffffffffffffe724 = CONCAT13(*(int *)&local_720->field_0x14 == -1,uVar15);
        }
        if ((char)(in_stack_ffffffffffffe724 >> 0x18) == '\0') {
          DebugUtils::assertionFailed
                    (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeafc,in_stack_ffffffffffffeaf0);
        }
        bVar5 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                          (local_720->field_0x11,kActsAsInst);
        if (bVar5) {
          if (in_RDI->_curBlock == (RABlock *)0x0) {
            removeNode((RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)
                       CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
                       (BaseNode *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
            local_720 = local_1778;
            goto LAB_001fae06;
          }
          in_RDI->_hasCode = true;
          if ((local_720->field_0x10 == '\x12') || (local_720->field_0x10 == '\x11')) {
            if (*(int *)&local_720->field_0x14 == -1) {
              *(undefined4 *)&local_720->field_0x14 = 0;
            }
            else {
              lVar3 = *(long *)local_720;
              if (local_720->field_0x10 == '\x12') {
                EVar6 = x86::RACFGBuilder::onBeforeInvoke
                                  (in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
              }
              else {
                EVar6 = x86::RACFGBuilder::onBeforeRet
                                  (in_stack_ffffffffffffe7d0,
                                   (FuncRetNode *)
                                   CONCAT44(in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8));
              }
              if (EVar6 != 0) {
                return EVar6;
              }
              if (lVar3 != *(long *)local_720) {
                if (*(FuncNode **)(in_RDI->_curBlock + 0x10) == local_720) {
                  *(undefined8 *)(in_RDI->_curBlock + 0x10) = *(undefined8 *)(lVar3 + 8);
                }
                *(undefined4 *)&local_720->field_0x14 = 0xffffffff;
                local_720 = *(FuncNode **)(lVar3 + 8);
                bVar5 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                                  (local_720->field_0x11,kActsAsInst);
                if (!bVar5) {
                  DebugUtils::assertionFailed
                            (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeafc,
                             in_stack_ffffffffffffeaf0);
                }
              }
              local_1778 = *(FuncNode **)&local_720->field_0x8;
            }
          }
          logNode((RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)in_stack_ffffffffffffe710,
                  (BaseNode *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
                  in_stack_ffffffffffffe704,(char *)in_stack_ffffffffffffe6f8);
          local_1794 = 0;
          local_1760 = *(undefined4 *)(in_RDI->_curBlock + 8);
          in_stack_ffffffffffffe718 = (BaseRAPass *)&local_1760;
          local_175c = 0;
          uVar17 = 0;
          uVar17 = 0;
          uVar17 = 0;
          RVar18._packed = 0;
          local_88 = aAStack_1748;
          local_8c = 0;
          Support::Array<unsigned_int,_4UL>::fill(local_88,&local_8c);
          local_98 = (RARegsStats *)&in_stack_ffffffffffffe718->field_0x28;
          local_9c = 0;
          Support::Array<unsigned_int,_4UL>::fill((Array<unsigned_int,_4UL> *)local_98,&local_9c);
          *(undefined1 **)&in_stack_ffffffffffffe718->field_0x38 =
               &in_stack_ffffffffffffe718->field_0x40;
          EVar6 = x86::RACFGBuilder::onInst
                            (in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,
                             (InstControlFlow *)in_stack_ffffffffffffea30._data,
                             in_stack_ffffffffffffea28);
          if (EVar6 != 0) {
            return EVar6;
          }
          if ((local_720->field_0x10 == '\x12') &&
             (EVar6 = x86::RACFGBuilder::onInvoke
                                ((RACFGBuilder *)
                                 CONCAT44(in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8),
                                 in_stack_ffffffffffffe7c0,
                                 (RAInstBuilder *)
                                 CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8)),
             EVar6 != 0)) {
            return EVar6;
          }
          if (local_720->field_0x10 == '\x11') {
            EVar6 = x86::RACFGBuilder::onRet
                              ((RACFGBuilder *)in_stack_ffffffffffffe780,
                               (FuncRetNode *)
                               CONCAT44(in_stack_ffffffffffffe77c,in_stack_ffffffffffffe778),
                               (RAInstBuilder *)in_stack_ffffffffffffe770);
            if (EVar6 != 0) {
              return EVar6;
            }
            local_1794 = 4;
          }
          puVar4 = local_1728;
          if (local_1794 == 1) {
            for (local_17b8 = local_1720; local_17b8 != puVar4; local_17b8 = local_17b8 + 0x20) {
              ppRVar7 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                                  ((ZoneVector<asmjit::v1_14::RAWorkReg_*> *)
                                   CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
                                   CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
              if ((*(uint *)(*ppRVar7 + 0x20) >> 8 & 0xf) == 0) {
                bVar1 = local_17b8[0xe];
                if (bVar1 == 0xff) {
                  pbVar8 = Support::Array<unsigned_char,_2UL>::operator[]<unsigned_int>
                                     ((Array<unsigned_char,_2UL> *)
                                      CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                      (uint *)in_stack_ffffffffffffe6f8);
                  bVar1 = *pbVar8;
                  local_17b8[0xe] = bVar1;
                }
                in_stack_ffffffffffffe710 = (BaseRAPass *)in_RDI->_curBlock;
                *(uint *)&in_stack_ffffffffffffe710->_exits =
                     1 << (bVar1 & 0x1f) | *(uint *)&in_stack_ffffffffffffe710->_exits;
              }
            }
          }
          EVar6 = BaseRAPass::assignRAInst
                            ((BaseRAPass *)
                             CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760),
                             (BaseNode *)in_stack_ffffffffffffe758,in_stack_ffffffffffffe750,
                             in_stack_ffffffffffffe748);
          if (EVar6 != 0) {
            return EVar6;
          }
          (in_RDI->_blockRegStats)._packed =
               (uint32_t)((ulong)in_stack_ffffffffffffe8b0 >> 0x20) |
               (in_RDI->_blockRegStats)._packed;
          if (local_1794 != 0) {
            if ((local_1794 == 1) || (local_1794 == 2)) {
              *(FuncNode **)(in_RDI->_curBlock + 0x18) = local_720;
              *(uint *)(in_RDI->_curBlock + 0xc) = *(uint *)(in_RDI->_curBlock + 0xc) | 0x100;
              pRVar14 = in_RDI->_curBlock;
              pRVar10 = pRVar14 + 0xc;
              *(uint *)pRVar10 = *(uint *)pRVar10 | 1;
              pRVar14 = pRVar14 + 0x30;
              *(uint32_t *)pRVar14 = (in_RDI->_blockRegStats)._packed | *(uint *)pRVar14;
              local_58 = &local_720->field_0x30;
              local_5c = 2;
              bVar5 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                                (*(InstOptions *)&local_720->_funcDetail,kUnfollow);
              if (!bVar5) {
                if ((byte)local_720->field_0x12 == 0) {
                  EVar6 = DebugUtils::errored(3);
                  return EVar6;
                }
                if ((*(uint *)(&local_720->field_0x40 +
                              (ulong)((byte)local_720->field_0x12 - 1) * 0x10) & 7) == 5) {
                  in_stack_ffffffffffffe70c =
                       BaseBuilder::labelNodeOf
                                 ((BaseBuilder *)this_00,(LabelNode **)cbLabel,
                                  in_stack_ffffffffffffe724);
                  if (in_stack_ffffffffffffe70c != 0) {
                    return in_stack_ffffffffffffe70c;
                  }
                  pRVar14 = BaseRAPass::newBlockOrExistingAt
                                      (this_00,(LabelNode *)cbLabel,
                                       (BaseNode **)
                                       CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720)
                                      );
                  if (pRVar14 == (RABlock *)0x0) {
                    EVar6 = DebugUtils::errored(1);
                    return EVar6;
                  }
                  *(uint *)(pRVar14 + 0xc) = *(uint *)(pRVar14 + 0xc) | 4;
                  EVar6 = RABlock::appendSuccessor
                                    ((RABlock *)in_stack_ffffffffffffe718,
                                     (RABlock *)in_stack_ffffffffffffe710);
                }
                else {
                  local_1810 = 0;
                  *(uint *)(in_RDI->_curBlock + 0xc) = *(uint *)(in_RDI->_curBlock + 0xc) | 0x400;
                  if (local_720->field_0x10 == '\x0f') {
                    local_1810 = *(long *)&local_720->field_0x80;
                  }
                  if (local_1810 == 0) {
                    EVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::append
                                      ((ZoneVector<asmjit::v1_14::RABlock_*> *)
                                       in_stack_ffffffffffffe718,
                                       (ZoneAllocator *)in_stack_ffffffffffffe710,
                                       (RABlock **)
                                       CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708)
                                      );
                  }
                  else {
                    uVar9 = in_RDI->_pass->_lastTimestamp + 1;
                    in_RDI->_pass->_lastTimestamp = uVar9;
                    local_50 = (long *)(local_1810 + 0x10);
                    in_stack_ffffffffffffe7d0 =
                         (RACFGBuilder *)(*local_50 + (ulong)*(uint *)(local_1810 + 0x18) * 4);
                    local_48 = local_50;
                    for (local_1828 = (RACFGBuilder *)*local_50;
                        local_1828 != in_stack_ffffffffffffe7d0; local_1828 = local_1828 + 4) {
                      in_stack_ffffffffffffe7cc = *(undefined4 *)local_1828;
                      in_stack_ffffffffffffe708 =
                           BaseBuilder::labelNodeOf
                                     ((BaseBuilder *)this_00,(LabelNode **)cbLabel,
                                      in_stack_ffffffffffffe724);
                      if (in_stack_ffffffffffffe708 != 0) {
                        return in_stack_ffffffffffffe708;
                      }
                      in_stack_ffffffffffffe7bc = in_stack_ffffffffffffe708;
                      pRVar14 = BaseRAPass::newBlockOrExistingAt
                                          (this_00,(LabelNode *)cbLabel,
                                           (BaseNode **)
                                           CONCAT44(in_stack_ffffffffffffe724,
                                                    in_stack_ffffffffffffe720));
                      if (pRVar14 == (RABlock *)0x0) {
                        EVar6 = DebugUtils::errored(1);
                        return EVar6;
                      }
                      if (*(uint64_t *)(pRVar14 + 0x48) != uVar9) {
                        *(uint64_t *)(pRVar14 + 0x48) = uVar9;
                        *(uint *)(pRVar14 + 0xc) = *(uint *)(pRVar14 + 0xc) | 4;
                        EVar6 = RABlock::appendSuccessor
                                          ((RABlock *)in_stack_ffffffffffffe718,
                                           (RABlock *)in_stack_ffffffffffffe710);
                        if (EVar6 != 0) {
                          return EVar6;
                        }
                      }
                    }
                    EVar6 = shareAssignmentAcrossSuccessors
                                      (in_stack_ffffffffffffe758,in_stack_ffffffffffffe750);
                  }
                }
                if (EVar6 != 0) {
                  return EVar6;
                }
              }
              if (local_1794 != 1) {
                local_720 = local_1778;
                if (local_1778 == (FuncNode *)0x0) {
                  EVar6 = DebugUtils::errored(3);
                  return EVar6;
                }
                if (local_1778->field_0x10 == '\x03') {
                  if (*(long *)&local_1778->field_0x20 == 0) {
                    local_1868 = BaseRAPass::newBlock
                                           (in_stack_ffffffffffffe718,
                                            (BaseNode *)in_stack_ffffffffffffe710);
                    if (local_1868 == (RABlock *)0x0) {
                      EVar6 = DebugUtils::errored(1);
                      return EVar6;
                    }
                    *(RABlock **)&local_1778->field_0x20 = local_1868;
                  }
                  else {
                    local_1868 = *(RABlock **)&local_1778->field_0x20;
                  }
                }
                else {
                  local_1868 = BaseRAPass::newBlock
                                         (in_stack_ffffffffffffe718,
                                          (BaseNode *)in_stack_ffffffffffffe710);
                  if (local_1868 == (RABlock *)0x0) {
                    EVar6 = DebugUtils::errored(1);
                    return EVar6;
                  }
                }
                *(uint *)(in_RDI->_curBlock + 0xc) = *(uint *)(in_RDI->_curBlock + 0xc) | 0x200;
                EVar6 = RABlock::prependSuccessor
                                  ((RABlock *)in_stack_ffffffffffffe718,
                                   (RABlock *)in_stack_ffffffffffffe710);
                if (EVar6 != 0) {
                  return EVar6;
                }
                in_RDI->_curBlock = local_1868;
                in_RDI->_hasCode = false;
                (in_RDI->_blockRegStats)._packed = 0;
                local_38 = in_RDI->_curBlock;
                local_3c = 1;
                bVar5 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                                  (*(RABlockFlags *)(local_38 + 0xc),kIsConstructed);
                if (bVar5) goto LAB_001fcf66;
                EVar6 = BaseRAPass::addBlock
                                  (in_stack_ffffffffffffe710,
                                   (RABlock *)
                                   CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708));
                if (EVar6 != 0) {
                  return EVar6;
                }
                logBlock((RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)
                         in_stack_ffffffffffffe710,
                         (RABlock *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
                         in_stack_ffffffffffffe704);
                goto LAB_001fae06;
              }
              in_RDI->_curBlock = (RABlock *)0x0;
            }
            if (local_1794 == 4) {
              *(FuncNode **)(in_RDI->_curBlock + 0x18) = local_720;
              pRVar14 = in_RDI->_curBlock;
              pRVar10 = pRVar14 + 0xc;
              *(uint *)pRVar10 = *(uint *)pRVar10 | 1;
              pRVar14 = pRVar14 + 0x30;
              *(uint32_t *)pRVar14 = (in_RDI->_blockRegStats)._packed | *(uint *)pRVar14;
              EVar6 = RABlock::appendSuccessor
                                ((RABlock *)in_stack_ffffffffffffe718,
                                 (RABlock *)in_stack_ffffffffffffe710);
              if (EVar6 != 0) {
                return EVar6;
              }
              in_RDI->_curBlock = (RABlock *)0x0;
            }
          }
        }
        else if (local_720->field_0x10 == '\x03') {
          if (in_RDI->_curBlock == (RABlock *)0x0) {
            in_RDI->_curBlock = *(RABlock **)&local_720->field_0x20;
            if (in_RDI->_curBlock == (RABlock *)0x0) {
              pRVar14 = BaseRAPass::newBlock
                                  (in_stack_ffffffffffffe718,(BaseNode *)in_stack_ffffffffffffe710);
              in_RDI->_curBlock = pRVar14;
              if (in_RDI->_curBlock == (RABlock *)0x0) {
                EVar6 = DebugUtils::errored(1);
                return EVar6;
              }
              *(RABlock **)&local_720->field_0x20 = in_RDI->_curBlock;
            }
            else {
              local_28 = in_RDI->_curBlock;
              local_2c = 1;
              bVar5 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                                (*(RABlockFlags *)(local_28 + 0xc),kIsConstructed);
              if (bVar5) goto LAB_001fcf66;
            }
            *(uint *)(in_RDI->_curBlock + 0xc) = *(uint *)(in_RDI->_curBlock + 0xc) | 4;
            in_RDI->_hasCode = false;
            (in_RDI->_blockRegStats)._packed = 0;
            EVar6 = BaseRAPass::addBlock
                              (in_stack_ffffffffffffe710,
                               (RABlock *)
                               CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708));
            if (EVar6 != 0) {
              return EVar6;
            }
          }
          else if (*(long *)&local_720->field_0x20 == 0) {
            if (((in_RDI->_hasCode & 1U) != 0) || (in_RDI->_curBlock == pRVar2)) {
              if (*(FuncNode **)(in_RDI->_curBlock + 0x18) == local_720) {
                DebugUtils::assertionFailed
                          (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeafc,
                           in_stack_ffffffffffffeaf0);
              }
              *(long *)(in_RDI->_curBlock + 0x18) = *(long *)local_720;
              *(uint *)(in_RDI->_curBlock + 0xc) = *(uint *)(in_RDI->_curBlock + 0xc) | 0x200;
              pRVar14 = in_RDI->_curBlock;
              pRVar10 = pRVar14 + 0xc;
              *(uint *)pRVar10 = *(uint *)pRVar10 | 1;
              pRVar14 = pRVar14 + 0x30;
              *(uint32_t *)pRVar14 = (in_RDI->_blockRegStats)._packed | *(uint *)pRVar14;
              in_stack_ffffffffffffe770 =
                   BaseRAPass::newBlock
                             (in_stack_ffffffffffffe718,(BaseNode *)in_stack_ffffffffffffe710);
              if (in_stack_ffffffffffffe770 == (RABlock *)0x0) {
                EVar6 = DebugUtils::errored(1);
                return EVar6;
              }
              *(uint *)(in_stack_ffffffffffffe770 + 0xc) =
                   *(uint *)(in_stack_ffffffffffffe770 + 0xc) | 4;
              EVar6 = RABlock::appendSuccessor
                                ((RABlock *)in_stack_ffffffffffffe718,
                                 (RABlock *)in_stack_ffffffffffffe710);
              if (EVar6 != 0) {
                return EVar6;
              }
              EVar6 = BaseRAPass::addBlock
                                (in_stack_ffffffffffffe710,
                                 (RABlock *)
                                 CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708));
              if (EVar6 != 0) {
                return EVar6;
              }
              in_RDI->_curBlock = in_stack_ffffffffffffe770;
              in_RDI->_hasCode = false;
              (in_RDI->_blockRegStats)._packed = 0;
            }
            *(RABlock **)&local_720->field_0x20 = in_RDI->_curBlock;
          }
          else {
            in_stack_ffffffffffffe780 = *(BaseRAPass **)&local_720->field_0x20;
            puVar13 = (uint *)((long)&(in_stack_ffffffffffffe780->super_FuncPass).super_Pass._cb + 4
                              );
            *puVar13 = *puVar13 | 4;
            if ((BaseRAPass *)in_RDI->_curBlock == in_stack_ffffffffffffe780) {
              if ((in_RDI->_hasCode & 1U) != 0) {
                EVar6 = DebugUtils::errored(3);
                return EVar6;
              }
            }
            else {
              if (*(FuncNode **)(in_RDI->_curBlock + 0x18) == local_720) {
                DebugUtils::assertionFailed
                          (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeafc,
                           in_stack_ffffffffffffeaf0);
              }
              *(long *)(in_RDI->_curBlock + 0x18) = *(long *)local_720;
              *(uint *)(in_RDI->_curBlock + 0xc) = *(uint *)(in_RDI->_curBlock + 0xc) | 0x200;
              pRVar14 = in_RDI->_curBlock;
              pRVar10 = pRVar14 + 0xc;
              *(uint *)pRVar10 = *(uint *)pRVar10 | 1;
              pRVar14 = pRVar14 + 0x30;
              *(uint32_t *)pRVar14 = (in_RDI->_blockRegStats)._packed | *(uint *)pRVar14;
              in_stack_ffffffffffffe77c =
                   RABlock::appendSuccessor
                             ((RABlock *)in_stack_ffffffffffffe718,
                              (RABlock *)in_stack_ffffffffffffe710);
              if (in_stack_ffffffffffffe77c != 0) {
                return in_stack_ffffffffffffe77c;
              }
              EVar6 = BaseRAPass::addBlock
                                (in_stack_ffffffffffffe710,
                                 (RABlock *)
                                 CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708));
              if (EVar6 != 0) {
                return EVar6;
              }
              in_RDI->_curBlock = (RABlock *)in_stack_ffffffffffffe780;
              in_RDI->_hasCode = false;
              (in_RDI->_blockRegStats)._packed = 0;
              in_stack_ffffffffffffe778 = 0;
            }
          }
          if ((in_RDI->_curBlock != (RABlock *)0x0) &&
             (in_RDI->_curBlock != in_RDI->_lastLoggedBlock)) {
            logBlock((RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)in_stack_ffffffffffffe710,
                     (RABlock *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
                     in_stack_ffffffffffffe704);
          }
          logNode((RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)in_stack_ffffffffffffe710,
                  (BaseNode *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
                  in_stack_ffffffffffffe704,(char *)in_stack_ffffffffffffe6f8);
          if (*(uint32_t *)&local_720->field_0x30 == in_RDI->_exitLabelId) {
            *(FuncNode **)(in_RDI->_curBlock + 0x18) = local_720;
            pRVar14 = in_RDI->_curBlock;
            pRVar10 = pRVar14 + 0xc;
            *(uint *)pRVar10 = *(uint *)pRVar10 | 1;
            pRVar14 = pRVar14 + 0x30;
            *(uint32_t *)pRVar14 = (in_RDI->_blockRegStats)._packed | *(uint *)pRVar14;
            EVar6 = BaseRAPass::addExitBlock(in_stack_ffffffffffffe6f8,(RABlock *)0x1fcddf);
            if (EVar6 != 0) {
              return EVar6;
            }
            in_RDI->_curBlock = (RABlock *)0x0;
            in_stack_ffffffffffffe764 = 0;
          }
        }
        else {
          logNode((RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)in_stack_ffffffffffffe710,
                  (BaseNode *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
                  in_stack_ffffffffffffe704,(char *)in_stack_ffffffffffffe6f8);
          if (local_720->field_0x10 == '\n') {
            if (local_720 == (FuncNode *)in_RDI->_funcNode->_end) {
              bVar1 = 0;
              if (in_RDI->_curBlock != (RABlock *)0x0) {
                bVar1 = in_RDI->_hasCode;
              }
              if ((bVar1 & 1) != 0) {
                EVar6 = DebugUtils::errored(3);
                return EVar6;
              }
LAB_001fcf66:
              local_20 = in_RDI->_pass;
              local_18 = &local_20->_blocks;
              if (local_20->_createdBlockCount != *(uint32_t *)&local_20->field_0xb8) {
                EVar6 = DebugUtils::errored(3);
                return EVar6;
              }
              local_10 = &local_1770;
              pvVar11 = (void *)((long)local_1770._data + (ulong)local_1770._size * 8);
              local_8 = local_10;
              for (pvVar12 = local_1770._data; pvVar12 != pvVar11;
                  pvVar12 = (void *)((long)pvVar12 + 8)) {
                handleBlockWithUnknownJump(in_RDI,(RABlock *)this_00);
              }
              EVar6 = BaseRAPass::initSharedAssignments
                                (in_stack_ffffffffffffe780,
                                 (ZoneVector<unsigned_int> *)
                                 CONCAT44(in_stack_ffffffffffffe77c,in_stack_ffffffffffffe778));
              return EVar6;
            }
          }
          else if ((local_720->field_0x10 == '\x10') && (local_720 != in_RDI->_funcNode)) {
            EVar6 = DebugUtils::errored(3);
            return EVar6;
          }
        }
        local_720 = local_1778;
      } while (local_1778 != (FuncNode *)0x0);
      local_6fc = DebugUtils::errored(3);
    }
  }
  return local_6fc;
}

Assistant:

Error run() noexcept {
    log("[BuildCFG]\n");
    ASMJIT_PROPAGATE(prepare());

    logNode(_funcNode, kRootIndentation);
    logBlock(_curBlock, kRootIndentation);

    RABlock* entryBlock = _curBlock;
    BaseNode* node = _funcNode->next();

    if (ASMJIT_UNLIKELY(!node)) {
      return DebugUtils::errored(kErrorInvalidState);
    }

    _curBlock->setFirst(_funcNode);
    _curBlock->setLast(_funcNode);

    RAInstBuilder ib;
    ZoneVector<RABlock*> blocksWithUnknownJumps;

    for (;;) {
      BaseNode* next = node->next();
      ASMJIT_ASSERT(node->position() == 0 || node->position() == kNodePositionDidOnBefore);

      if (node->isInst()) {
        // Instruction | Jump | Invoke | Return
        // ------------------------------------

        // Handle `InstNode`, `InvokeNode`, and `FuncRetNode`. All of them share the same interface that provides
        // operands that have read/write semantics.
        if (ASMJIT_UNLIKELY(!_curBlock)) {
          // Unreachable code has to be removed, we cannot allocate registers in such code as we cannot do proper
          // liveness analysis in such case.
          removeNode(node);
          node = next;
          continue;
        }

        _hasCode = true;

        if (node->isInvoke() || node->isFuncRet()) {
          if (node->position() != kNodePositionDidOnBefore) {
            // Call and Reg are complicated as they may insert some surrounding code around them. The simplest
            // approach is to get the previous node, call the `onBefore()` handlers and then check whether
            // anything changed and restart if so. By restart we mean that the current `node` would go back to
            // the first possible inserted node by `onBeforeInvoke()` or `onBeforeRet()`.
            BaseNode* prev = node->prev();

            if (node->type() == NodeType::kInvoke) {
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeInvoke(node->as<InvokeNode>()));
            }
            else {
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeRet(node->as<FuncRetNode>()));
            }

            if (prev != node->prev()) {
              // If this was the first node in the block and something was
              // inserted before it then we have to update the first block.
              if (_curBlock->first() == node) {
                _curBlock->setFirst(prev->next());
              }

              node->setPosition(kNodePositionDidOnBefore);
              node = prev->next();

              // `onBeforeInvoke()` and `onBeforeRet()` can only insert instructions.
              ASMJIT_ASSERT(node->isInst());
            }

            // Necessary if something was inserted after `node`, but nothing before.
            next = node->next();
          }
          else {
            // Change the position back to its original value.
            node->setPosition(0);
          }
        }

        InstNode* inst = node->as<InstNode>();
        logNode(inst, kCodeIndentation);

        InstControlFlow cf = InstControlFlow::kRegular;
        ib.reset(_curBlock->blockId());
        ASMJIT_PROPAGATE(static_cast<This*>(this)->onInst(inst, cf, ib));

        if (node->isInvoke()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onInvoke(inst->as<InvokeNode>(), ib));
        }

        if (node->isFuncRet()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onRet(inst->as<FuncRetNode>(), ib));
          cf = InstControlFlow::kReturn;
        }

        if (cf == InstControlFlow::kJump) {
          uint32_t fixedRegCount = 0;
          for (RATiedReg& tiedReg : ib) {
            RAWorkReg* workReg = _pass->workRegById(tiedReg.workId());
            if (workReg->group() == RegGroup::kGp) {
              uint32_t useId = tiedReg.useId();
              if (useId == BaseReg::kIdBad) {
                useId = _pass->_scratchRegIndexes[fixedRegCount++];
                tiedReg.setUseId(useId);
              }
              _curBlock->addExitScratchGpRegs(Support::bitMask(useId));
            }
          }
        }

        ASMJIT_PROPAGATE(_pass->assignRAInst(inst, _curBlock, ib));
        _blockRegStats.combineWith(ib._stats);

        if (cf != InstControlFlow::kRegular) {
          // Support for conditional and unconditional jumps.
          if (cf == InstControlFlow::kJump || cf == InstControlFlow::kBranch) {
            _curBlock->setLast(node);
            _curBlock->addFlags(RABlockFlags::kHasTerminator);
            _curBlock->makeConstructed(_blockRegStats);

            if (!inst->hasOption(InstOptions::kUnfollow)) {
              // Jmp/Jcc/Call/Loop/etc...
              uint32_t opCount = inst->opCount();
              const Operand* opArray = inst->operands();

              // Cannot jump anywhere without operands.
              if (ASMJIT_UNLIKELY(!opCount)) {
                return DebugUtils::errored(kErrorInvalidState);
              }

              if (opArray[opCount - 1].isLabel()) {
                // Labels are easy for constructing the control flow.
                LabelNode* labelNode;
                ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, opArray[opCount - 1].as<Label>()));

                RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                if (ASMJIT_UNLIKELY(!targetBlock)) {
                  return DebugUtils::errored(kErrorOutOfMemory);
                }

                targetBlock->makeTargetable();
                ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
              }
              else {
                // Not a label - could be jump with reg/mem operand, which means that it can go anywhere. Such jumps
                // must either be annotated so the CFG can be properly constructed, otherwise we assume the worst case
                // - can jump to any basic block.
                JumpAnnotation* jumpAnnotation = nullptr;
                _curBlock->addFlags(RABlockFlags::kHasJumpTable);

                if (inst->type() == NodeType::kJump) {
                  jumpAnnotation = inst->as<JumpNode>()->annotation();
                }

                if (jumpAnnotation) {
                  uint64_t timestamp = _pass->nextTimestamp();
                  for (uint32_t id : jumpAnnotation->labelIds()) {
                    LabelNode* labelNode;
                    ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, id));

                    RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                    if (ASMJIT_UNLIKELY(!targetBlock)) {
                      return DebugUtils::errored(kErrorOutOfMemory);
                    }

                    // Prevents adding basic-block successors multiple times.
                    if (!targetBlock->hasTimestamp(timestamp)) {
                      targetBlock->setTimestamp(timestamp);
                      targetBlock->makeTargetable();
                      ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
                    }
                  }
                  ASMJIT_PROPAGATE(shareAssignmentAcrossSuccessors(_curBlock));
                }
                else {
                  ASMJIT_PROPAGATE(blocksWithUnknownJumps.append(_pass->allocator(), _curBlock));
                }
              }
            }

            if (cf == InstControlFlow::kJump) {
              // Unconditional jump makes the code after the jump unreachable, which will be removed instantly during
              // the CFG construction; as we cannot allocate registers for instructions that are not part of any block.
              // Of course we can leave these instructions as they are, however, that would only postpone the problem
              // as assemblers can't encode instructions that use virtual registers.
              _curBlock = nullptr;
            }
            else {
              node = next;
              if (ASMJIT_UNLIKELY(!node))
                return DebugUtils::errored(kErrorInvalidState);

              RABlock* consecutiveBlock;
              if (node->type() == NodeType::kLabel) {
                if (node->hasPassData()) {
                  consecutiveBlock = node->passData<RABlock>();
                }
                else {
                  consecutiveBlock = _pass->newBlock(node);
                  if (ASMJIT_UNLIKELY(!consecutiveBlock)) {
                    return DebugUtils::errored(kErrorOutOfMemory);
                  }
                  node->setPassData<RABlock>(consecutiveBlock);
                }
              }
              else {
                consecutiveBlock = _pass->newBlock(node);
                if (ASMJIT_UNLIKELY(!consecutiveBlock)) {
                  return DebugUtils::errored(kErrorOutOfMemory);
                }
              }

              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              ASMJIT_PROPAGATE(_curBlock->prependSuccessor(consecutiveBlock));

              _curBlock = consecutiveBlock;
              _hasCode = false;
              _blockRegStats.reset();

              if (_curBlock->isConstructed())
                break;
              ASMJIT_PROPAGATE(_pass->addBlock(consecutiveBlock));

              logBlock(_curBlock, kRootIndentation);
              continue;
            }
          }

          if (cf == InstControlFlow::kReturn) {
            _curBlock->setLast(node);
            _curBlock->makeConstructed(_blockRegStats);
            ASMJIT_PROPAGATE(_curBlock->appendSuccessor(_retBlock));

            _curBlock = nullptr;
          }
        }
      }
      else if (node->type() == NodeType::kLabel) {
        // Label - Basic-Block Management
        // ------------------------------

        if (!_curBlock) {
          // If the current code is unreachable the label makes it reachable again. We may remove the whole block in
          // the future if it's not referenced though.
          _curBlock = node->passData<RABlock>();

          if (_curBlock) {
            // If the label has a block assigned we can either continue with it or skip it if the block has been
            // constructed already.
            if (_curBlock->isConstructed()) {
              break;
            }
          }
          else {
            // No block assigned - create a new one and assign it.
            _curBlock = _pass->newBlock(node);
            if (ASMJIT_UNLIKELY(!_curBlock)) {
              return DebugUtils::errored(kErrorOutOfMemory);
            }
            node->setPassData<RABlock>(_curBlock);
          }

          _curBlock->makeTargetable();
          _hasCode = false;
          _blockRegStats.reset();
          ASMJIT_PROPAGATE(_pass->addBlock(_curBlock));
        }
        else {
          if (node->hasPassData()) {
            RABlock* consecutive = node->passData<RABlock>();
            consecutive->makeTargetable();

            if (_curBlock == consecutive) {
              // The label currently processed is part of the current block. This is only possible for multiple labels
              // that are right next to each other or labels that are separated by non-code nodes like directives and
              // comments.
              if (ASMJIT_UNLIKELY(_hasCode)) {
                return DebugUtils::errored(kErrorInvalidState);
              }
            }
            else {
              // Label makes the current block constructed. There is a chance that the Label is not used, but we don't
              // know that at this point. In the worst case there would be two blocks next to each other, it's just fine.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }
          }
          else {
            // First time we see this label.
            if (_hasCode || _curBlock == entryBlock) {
              // Cannot continue the current block if it already contains some code or it's a block entry. We need to
              // create a new block and make it a successor.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              RABlock* consecutive = _pass->newBlock(node);
              if (ASMJIT_UNLIKELY(!consecutive)) {
                return DebugUtils::errored(kErrorOutOfMemory);
              }
              consecutive->makeTargetable();

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }

            node->setPassData<RABlock>(_curBlock);
          }
        }

        if (_curBlock && _curBlock != _lastLoggedBlock) {
          logBlock(_curBlock, kRootIndentation);
        }
        logNode(node, kRootIndentation);

        // Unlikely: Assume that the exit label is reached only once per function.
        if (ASMJIT_UNLIKELY(node->as<LabelNode>()->labelId() == _exitLabelId)) {
          _curBlock->setLast(node);
          _curBlock->makeConstructed(_blockRegStats);
          ASMJIT_PROPAGATE(_pass->addExitBlock(_curBlock));

          _curBlock = nullptr;
        }
      }
      else {
        // Other Nodes | Function Exit
        // ---------------------------

        logNode(node, kCodeIndentation);

        if (node->type() == NodeType::kSentinel) {
          if (node == _funcNode->endNode()) {
            // Make sure we didn't flow here if this is the end of the function sentinel.
            if (ASMJIT_UNLIKELY(_curBlock && _hasCode))
              return DebugUtils::errored(kErrorInvalidState);
            break;
          }
        }
        else if (node->type() == NodeType::kFunc) {
          // RAPass can only compile a single function at a time. If we
          // encountered a function it must be the current one, bail if not.
          if (ASMJIT_UNLIKELY(node != _funcNode))
            return DebugUtils::errored(kErrorInvalidState);
          // PASS if this is the first node.
        }
        else {
          // PASS if this is a non-interesting or unknown node.
        }
      }

      // Advance to the next node.
      node = next;

      // NOTE: We cannot encounter a NULL node, because every function must be terminated by a sentinel (`stop`)
      // node. If we encountered a NULL node it means that something went wrong and this node list is corrupted;
      // bail in such case.
      if (ASMJIT_UNLIKELY(!node))
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (_pass->hasDanglingBlocks())
      return DebugUtils::errored(kErrorInvalidState);

    for (RABlock* block : blocksWithUnknownJumps)
      handleBlockWithUnknownJump(block);

    return _pass->initSharedAssignments(_sharedAssignmentsMap);
  }